

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcand.c
# Opt level: O0

void child_handler(int signum)

{
  uint in_EDI;
  
  switch(in_EDI) {
  case 2:
  case 0xf:
    (*syslogger)(5,"received signal %i on %s",(ulong)in_EDI,ttypath);
    exit_code = 0;
    slcand_running = 0;
    break;
  case 10:
    exit(0);
  case 0xe:
  case 0x11:
    (*syslogger)(5,"received signal %i on %s",(ulong)in_EDI,ttypath);
    exit_code = 1;
    slcand_running = 0;
  }
  return;
}

Assistant:

static void child_handler(int signum)
{
	switch (signum) {

	case SIGUSR1:
		/* exit parent */
		exit(EXIT_SUCCESS);
		break;
	case SIGALRM:
	case SIGCHLD:
		syslogger(LOG_NOTICE, "received signal %i on %s", signum, ttypath);
		exit_code = EXIT_FAILURE;
		slcand_running = 0;
		break;
	case SIGINT:
	case SIGTERM:
		syslogger(LOG_NOTICE, "received signal %i on %s", signum, ttypath);
		exit_code = EXIT_SUCCESS;
		slcand_running = 0;
		break;
	}
}